

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstate.cpp
# Opt level: O2

void __thiscall stackjit::VMState::VMState(VMState *this,VMStateConfig config)

{
  undefined8 uVar1;
  VMStateConfig VVar2;
  
  VVar2 = config;
  uVar1 = config._12_8_;
  (this->config).allocationsBeforeGC = (int)uVar1;
  (this->config).printStackFrame = (bool)(char)((ulong)uVar1 >> 0x20);
  (this->config).printLazyPatching = (bool)(char)((ulong)uVar1 >> 0x28);
  (this->config).printFunctionGeneration = (bool)(char)((ulong)uVar1 >> 0x30);
  (this->config).printGCPeriod = (bool)(char)((ulong)uVar1 >> 0x38);
  (this->config).printGCStats = config.printGCStats;
  (this->config).printAliveObjects = config.printAliveObjects;
  (this->config).printGCStackTrace = config.printGCStackTrace;
  (this->config).printAllocation = config.printAllocation;
  (this->config).printDeallocation = config.printDeallocation;
  (this->config).printGCPromotion = config.printGCPromotion;
  (this->config).printVirtualFunctionTableLayout = config.printVirtualFunctionTableLayout;
  (this->config).field_0x1b = config._27_1_;
  uVar1 = VVar2._8_8_;
  (this->config).enableDebug = config.enableDebug;
  (this->config).testMode = config.testMode;
  *(undefined2 *)&(this->config).field_0x2 = config._2_2_;
  (this->config).programLoadMode = config.programLoadMode;
  (this->config).outputGeneratedCode = (bool)(char)uVar1;
  (this->config).disableGC = (bool)(char)((ulong)uVar1 >> 8);
  (this->config).loadRuntimeLibrary = (bool)(char)((ulong)uVar1 >> 0x10);
  (this->config).lazyJIT = (bool)(char)((ulong)uVar1 >> 0x18);
  (this->config).allocationsBeforeGC = (int)((ulong)uVar1 >> 0x20);
  (this->mClassProvider).mClassesMetadata._M_h._M_buckets =
       &(this->mClassProvider).mClassesMetadata._M_h._M_single_bucket;
  (this->mClassProvider).mClassesMetadata._M_h._M_bucket_count = 1;
  (this->mClassProvider).mClassesMetadata._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mClassProvider).mClassesMetadata._M_h._M_element_count = 0;
  (this->mClassProvider).mClassesMetadata._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mClassProvider).mClassesMetadata._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mClassProvider).mClassesMetadata._M_h._M_single_bucket = (__node_base_ptr)0x0;
  TypeProvider::TypeProvider(&this->mTypeProvider,&this->mClassProvider);
  (this->mBinder).mDefinedFunctions._M_h._M_buckets =
       &(this->mBinder).mDefinedFunctions._M_h._M_single_bucket;
  (this->mBinder).mDefinedFunctions._M_h._M_bucket_count = 1;
  (this->mBinder).mDefinedFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mBinder).mDefinedFunctions._M_h._M_element_count = 0;
  (this->mBinder).mDefinedFunctions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mBinder).mDefinedFunctions._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mBinder).mDefinedFunctions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GarbageCollector::GarbageCollector(&this->mGC,this);
  ExecutionEngine::ExecutionEngine(&this->mEngine,this);
  return;
}

Assistant:

VMState::VMState(VMStateConfig config)
	    : config(config),
		  mTypeProvider(mClassProvider),
		  mGC(*this),
		  mEngine(*this) {

	}